

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

void __thiscall setup::registry_entry::load(registry_entry *this,istream *is,info *i)

{
  log_level lVar1;
  value_type vVar2;
  undefined1 *puVar3;
  logger *plVar4;
  ulong uVar5;
  char buffer_6 [1];
  stored_flag_reader<flags<setup::registry_entry::flags_Enum_,_12UL>_> flagreader;
  undefined1 local_1a9;
  undefined1 local_1a8 [16];
  size_t local_198;
  stored_type local_190;
  _Base_bitset<1UL> local_188;
  size_t sStack_180;
  
  if ((i->version).value < 0x1030000) {
    std::istream::read((char *)is,(long)local_1a8);
  }
  util::encoded_string::load(is,&this->key,i->codepage,&(i->header).lead_bytes);
  if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) {
    util::encoded_string::load(is,&this->name,i->codepage,(bitset<256UL> *)0x0);
  }
  else {
    (this->name)._M_string_length = 0;
    *(this->name)._M_dataplus._M_p = '\0';
  }
  util::binary_string::load(is,&this->value);
  item::load_condition_data(&this->super_item,is,i);
  if ((i->version).value + 0xfbfff500 < 0xf500) {
    util::binary_string::load(is,&this->permissions);
  }
  else {
    (this->permissions)._M_string_length = 0;
    *(this->permissions)._M_dataplus._M_p = '\0';
  }
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  lVar1 = 7;
  if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) {
    std::istream::read((char *)is,(long)local_1a8);
    lVar1 = local_1a8._0_4_ & 0x7fffffff;
  }
  this->hive = lVar1;
  if ((i->version).value < 0x4010000) {
    this->permission = -1;
LAB_00141e2d:
    if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) {
      std::istream::read((char *)is,(long)local_1a8);
      uVar5 = local_1a8._0_8_ & 0xff;
      if (5 < uVar5) {
        local_1a8._0_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1a8 + 8),"Unexpected ",0xb);
        plVar4 = logger::operator<<((logger *)local_1a8,
                                    &enum_names<setup::registry_entry::value_type>::name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&plVar4->buffer," value: ",8);
        std::ostream::_M_insert<unsigned_long>((ulong)&plVar4->buffer);
LAB_00141fb4:
        logger::~logger((logger *)local_1a8);
        vVar2 = None;
        goto LAB_00141fc0;
      }
      puVar3 = (anonymous_namespace)::stored_registry_entry_type_1::values;
    }
    else {
      std::istream::read((char *)is,(long)local_1a8);
      uVar5 = local_1a8._0_8_ & 0xff;
      if (1 < uVar5) {
        local_1a8._0_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1a8 + 8),"Unexpected ",0xb);
        plVar4 = logger::operator<<((logger *)local_1a8,
                                    &enum_names<setup::registry_entry::value_type>::name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&plVar4->buffer," value: ",8);
        std::ostream::_M_insert<unsigned_long>((ulong)&plVar4->buffer);
        goto LAB_00141fb4;
      }
      puVar3 = (undefined1 *)&(anonymous_namespace)::stored_registry_entry_type_0::values;
    }
  }
  else {
    std::istream::read((char *)is,(long)local_1a8);
    this->permission = (int)(short)local_1a8._0_2_;
    if ((i->version).value < 0x5020500) goto LAB_00141e2d;
    std::istream::read((char *)is,(long)local_1a8);
    uVar5 = local_1a8._0_8_ & 0xff;
    if (6 < uVar5) {
      local_1a8._0_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 8),"Unexpected ",0xb);
      plVar4 = logger::operator<<((logger *)local_1a8,
                                  &enum_names<setup::registry_entry::value_type>::name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&plVar4->buffer," value: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)&plVar4->buffer);
      goto LAB_00141fb4;
    }
    puVar3 = (anonymous_namespace)::stored_registry_entry_type_2::values;
  }
  vVar2 = *(value_type *)((long)puVar3 + uVar5 * 4);
LAB_00141fc0:
  this->type = vVar2;
  uVar5 = (i->version).variant._flags.super__Base_bitset<1UL>._M_w;
  local_1a8._0_8_ = (ulong)((uVar5 & 1) == 0) * 0x10 + 0x10;
  local_198 = 0;
  local_190 = '\0';
  local_188._M_w = 0;
  sStack_180 = 0;
  local_1a8._8_8_ = is;
  if ((uVar5 & 1) == 0) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,VersionInfoValid);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,VersionInfoNotValid);
  }
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,TimeStampInUTC);
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,IsUninstallerExe);
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,
             CallInstructionOptimized);
  if (0x10205ff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,Touch);
    if (0x10308ff < (i->version).value) {
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,ChunkEncrypted);
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,ChunkCompressed);
      if (0x1030bff < (i->version).value) {
        stored_flag_reader<setup::data_entry::flags_Enum_>::add
                  ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,SolidBreak);
        if (0x1030fff < (i->version).value) {
          stored_flag_reader<setup::data_entry::flags_Enum_>::add
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,Sign);
          if (0x500ffff < (i->version).value) {
            stored_flag_reader<setup::data_entry::flags_Enum_>::add
                      ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,SignOnce);
            stored_flag_reader<setup::data_entry::flags_Enum_>::add
                      ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,BZipped);
          }
        }
      }
    }
  }
  if ((sStack_180 == 3) && (local_1a8._0_8_ == 0x20)) {
    std::istream::read((char *)local_1a8._8_8_,(long)&local_1a9);
  }
  (this->options)._flags.super__Base_bitset<1UL>._M_w = local_188._M_w;
  return;
}

Assistant:

void registry_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(key, i.codepage, i.header.lead_bytes);
	if(i.version.bits() != 16) {
		is >> util::encoded_string(name, i.codepage);
	} else {
		name.clear();
	}
	is >> util::binary_string(value);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(4, 0, 11) && i.version < INNO_VERSION(4, 1, 0)) {
		is >> util::binary_string(permissions);
	} else {
		permissions.clear();
	}
	
	load_version_data(is, i.version);
	
	if(i.version.bits() != 16) {
		hive = hive_name(util::load<boost::uint32_t>(is) & ~0x80000000);
	} else {
		hive = Unset;
	}
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		permission = util::load<boost::int16_t>(is);
	} else {
		permission = -1;
	}
	
	if(i.version >= INNO_VERSION(5, 2, 5)) {
		type = stored_enum<stored_registry_entry_type_2>(is).get();
	} else if(i.version.bits() != 16) {
		type = stored_enum<stored_registry_entry_type_1>(is).get();
	} else {
		type = stored_enum<stored_registry_entry_type_0>(is).get();
	}
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	if(i.version.bits() != 16) {
		flagreader.add(CreateValueIfDoesntExist);
		flagreader.add(UninsDeleteValue);
	}
	flagreader.add(UninsClearValue);
	flagreader.add(UninsDeleteEntireKey);
	flagreader.add(UninsDeleteEntireKeyIfEmpty);
	if(i.version >= INNO_VERSION(1, 2, 6)) {
		flagreader.add(PreserveStringType);
	}
	if(i.version >= INNO_VERSION(1, 3, 9)) {
		flagreader.add(DeleteKey);
		flagreader.add(DeleteValue);
	}
	if(i.version >= INNO_VERSION(1, 3, 12)) {
		flagreader.add(NoError);
	}
	if(i.version >= INNO_VERSION(1, 3, 16)) {
		flagreader.add(DontCreateKey);
	}
	if(i.version >= INNO_VERSION(5, 1, 0)) {
		flagreader.add(Bits32);
		flagreader.add(Bits64);
	}
	
	options = flagreader.finalize();
}